

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

TriQuadMesh * pbrt::TriQuadMesh::ReadPLY(string *filename)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *property_name;
  vector<int,_std::allocator<int>_> *this;
  TriQuadMesh *pTVar4;
  size_type sVar5;
  reference piVar6;
  p_ply ptVar7;
  TriQuadMesh *in_RDI;
  int idx_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int idx;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  FaceCallbackContext context;
  long nInstances;
  char *name;
  size_t faceCount;
  size_t vertexCount;
  p_ply_element element;
  p_ply ply;
  TriQuadMesh *mesh;
  p_ply in_stack_fffffffffffffdf8;
  TriQuadMesh *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  p_ply_read_cb in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  p_ply in_stack_fffffffffffffe20;
  p_ply in_stack_fffffffffffffe28;
  p_ply in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe38;
  p_ply in_stack_fffffffffffffe40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c8;
  vector<int,_std::allocator<int>_> *local_c0;
  undefined4 local_b8;
  int local_b4;
  int *local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  long local_58;
  char *local_50;
  long local_48;
  long local_40;
  p_ply_element local_38;
  p_ply local_20;
  byte local_11;
  
  local_11 = 0;
  TriQuadMesh(in_stack_fffffffffffffe00);
  std::__cxx11::string::c_str();
  local_20 = ply_open((char *)in_stack_fffffffffffffe38,(p_ply_error_cb)in_stack_fffffffffffffe30,
                      (long)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  if (local_20 == (p_ply)0x0) {
    ErrorExit<std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffe30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe28);
  }
  iVar2 = ply_read_header(in_stack_fffffffffffffdf8);
  if (iVar2 == 0) {
    ErrorExit<std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffe30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe28);
  }
  local_38 = (p_ply_element)0x0;
  local_40 = 0;
  local_48 = 0;
  while (local_38 = ply_get_next_element(local_20,local_38), local_38 != (p_ply_element)0x0) {
    ply_get_element_info(local_38,&local_50,&local_58);
    iVar2 = strcmp(local_50,"vertex");
    if (iVar2 == 0) {
      local_40 = local_58;
    }
    else {
      iVar2 = strcmp(local_50,"face");
      if (iVar2 == 0) {
        local_48 = local_58;
      }
    }
  }
  if ((local_40 == 0) || (local_48 == 0)) {
    ErrorExit<std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffe30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe28);
  }
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::resize
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::data
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)0x5a47a9);
  lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                          in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                          (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                          (long)in_stack_fffffffffffffe00);
  if (lVar3 == 0) {
LAB_005a48b0:
    ErrorExit<std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffe30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe28);
  }
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::data
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)0x5a480d);
  lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                          in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                          (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                          (long)in_stack_fffffffffffffe00);
  if (lVar3 == 0) goto LAB_005a48b0;
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::data
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)0x5a486d);
  lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                          in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                          (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                          (long)in_stack_fffffffffffffe00);
  if (lVar3 == 0) goto LAB_005a48b0;
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::resize
            ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
             in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::data
            ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)0x5a4902);
  lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                          in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                          (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                          (long)in_stack_fffffffffffffe00);
  if (lVar3 == 0) {
LAB_005a4a11:
    std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::resize
              ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
               in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
  }
  else {
    std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::data
              ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)0x5a496a);
    lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                            in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                            (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                            (long)in_stack_fffffffffffffe00);
    if (lVar3 == 0) goto LAB_005a4a11;
    std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::data
              ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)0x5a49ce);
    lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                            in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                            (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                            (long)in_stack_fffffffffffffe00);
    if (lVar3 == 0) goto LAB_005a4a11;
  }
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::resize
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::data
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x5a4a66);
  lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                          in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                          (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                          (long)in_stack_fffffffffffffe00);
  if (lVar3 != 0) {
    std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::data
              ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x5a4aca);
    lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                            in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                            (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                            (long)in_stack_fffffffffffffe00);
    if (lVar3 != 0) goto LAB_005a4d4a;
  }
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::data
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x5a4b2f);
  lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                          in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                          (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                          (long)in_stack_fffffffffffffe00);
  if (lVar3 != 0) {
    std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::data
              ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x5a4b8d);
    lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                            in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                            (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                            (long)in_stack_fffffffffffffe00);
    if (lVar3 != 0) goto LAB_005a4d4a;
  }
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::data
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x5a4be9);
  lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                          in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                          (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                          (long)in_stack_fffffffffffffe00);
  if (lVar3 != 0) {
    in_stack_fffffffffffffe40 = local_20;
    std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::data
              ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x5a4c41);
    lVar3 = ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                            in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                            (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                            (long)in_stack_fffffffffffffe00);
    if (lVar3 != 0) goto LAB_005a4d4a;
  }
  in_stack_fffffffffffffe30 = local_20;
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::data
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x5a4c9d);
  in_stack_fffffffffffffe38 =
       (int *)ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                              in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                              (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                              (long)in_stack_fffffffffffffe00);
  if (in_stack_fffffffffffffe38 != (int *)0x0) {
    in_stack_fffffffffffffe20 = local_20;
    std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::data
              ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x5a4cf5);
    in_stack_fffffffffffffe28 =
         (p_ply)ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                                in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                                (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08
                                                ),(long)in_stack_fffffffffffffe00);
    if (in_stack_fffffffffffffe28 != (p_ply)0x0) goto LAB_005a4d4a;
  }
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::resize
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
LAB_005a4d4a:
  FaceCallbackContext::FaceCallbackContext((FaceCallbackContext *)in_stack_fffffffffffffe00);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe30,
             (size_type)in_stack_fffffffffffffe28);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe30,
             (size_type)in_stack_fffffffffffffe28);
  property_name =
       (char *)ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                               in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                               (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                               ,(long)in_stack_fffffffffffffe00);
  if (property_name == (char *)0x0) {
    ErrorExit<std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffe30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe28);
  }
  this = (vector<int,_std::allocator<int>_> *)
         ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,property_name,
                         in_stack_fffffffffffffe10,
                         (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                         (long)in_stack_fffffffffffffe00);
  if (this != (vector<int,_std::allocator<int>_> *)0x0) {
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe30,
               (size_type)in_stack_fffffffffffffe28);
  }
  iVar2 = ply_read((p_ply)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  if (iVar2 == 0) {
    ErrorExit<std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffe30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe28);
  }
  std::vector<int,_std::allocator<int>_>::operator=
            (this,(vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_fffffffffffffe08));
  std::vector<int,_std::allocator<int>_>::operator=
            (this,(vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_fffffffffffffe08));
  ply_close((p_ply)CONCAT44(iVar2,in_stack_fffffffffffffe08));
  local_a0 = &in_RDI->triIndices;
  local_a8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf8);
  local_b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffffe00,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffffdf8), bVar1) {
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_a8);
    local_b4 = *piVar6;
    if (local_b4 < 0) {
LAB_005a4f82:
      sVar5 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                        (&in_RDI->p);
      local_b8 = (undefined4)sVar5;
      ErrorExit<int&,int>((char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                          (int *)in_stack_fffffffffffffe30);
    }
    in_stack_fffffffffffffe00 = (TriQuadMesh *)(long)local_b4;
    pTVar4 = (TriQuadMesh *)
             std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                       (&in_RDI->p);
    if (pTVar4 <= in_stack_fffffffffffffe00) goto LAB_005a4f82;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_a8);
  }
  local_c0 = &in_RDI->quadIndices;
  local_c8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf8);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffe00,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffdf8);
    if (!bVar1) {
      local_11 = 1;
      FaceCallbackContext::~FaceCallbackContext((FaceCallbackContext *)in_stack_fffffffffffffe00);
      if ((local_11 & 1) == 0) {
        ~TriQuadMesh(in_stack_fffffffffffffe00);
      }
      return in_RDI;
    }
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_c8);
    if (*piVar6 < 0) break;
    in_stack_fffffffffffffdf8 = (p_ply)(long)*piVar6;
    ptVar7 = (p_ply)std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                              (&in_RDI->p);
    if (ptVar7 <= in_stack_fffffffffffffdf8) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_c8);
  }
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(&in_RDI->p);
  ErrorExit<int&,int>((char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                      (int *)in_stack_fffffffffffffe30);
}

Assistant:

TriQuadMesh TriQuadMesh::ReadPLY(const std::string &filename) {
    TriQuadMesh mesh;

    p_ply ply = ply_open(filename.c_str(), rply_message_callback, 0, nullptr);
    if (ply == nullptr)
        ErrorExit("Couldn't open PLY file \"%s\"", filename);

    if (ply_read_header(ply) == 0)
        ErrorExit("Unable to read the header of PLY file \"%s\"", filename);

    p_ply_element element = nullptr;
    size_t vertexCount = 0, faceCount = 0;

    /* Inspect the structure of the PLY file */
    while ((element = ply_get_next_element(ply, element)) != nullptr) {
        const char *name;
        long nInstances;

        ply_get_element_info(element, &name, &nInstances);
        if (strcmp(name, "vertex") == 0)
            vertexCount = nInstances;
        else if (strcmp(name, "face") == 0)
            faceCount = nInstances;
    }

    if (vertexCount == 0 || faceCount == 0)
        ErrorExit("%s: PLY file is invalid! No face/vertex elements found!", filename);

    mesh.p.resize(vertexCount);
    if (ply_set_read_cb(ply, "vertex", "x", rply_vertex_callback, mesh.p.data(), 0x30) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "y", rply_vertex_callback, mesh.p.data(), 0x31) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "z", rply_vertex_callback, mesh.p.data(), 0x32) ==
            0) {
        ErrorExit("%s: Vertex coordinate property not found!", filename);
    }

    mesh.n.resize(vertexCount);
    if (ply_set_read_cb(ply, "vertex", "nx", rply_vertex_callback, mesh.n.data(), 0x30) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "ny", rply_vertex_callback, mesh.n.data(), 0x31) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "nz", rply_vertex_callback, mesh.n.data(), 0x32) ==
            0)
        mesh.n.resize(0);

    /* There seem to be lots of different conventions regarding UV coordinate
     * names */
    mesh.uv.resize(vertexCount);
    if (((ply_set_read_cb(ply, "vertex", "u", rply_vertex_callback, mesh.uv.data(),
                          0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "v", rply_vertex_callback, mesh.uv.data(),
                          0x21) != 0)) ||
        ((ply_set_read_cb(ply, "vertex", "s", rply_vertex_callback, mesh.uv.data(),
                          0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "t", rply_vertex_callback, mesh.uv.data(),
                          0x21) != 0)) ||
        ((ply_set_read_cb(ply, "vertex", "texture_u", rply_vertex_callback,
                          mesh.uv.data(), 0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "texture_v", rply_vertex_callback,
                          mesh.uv.data(), 0x21) != 0)) ||
        ((ply_set_read_cb(ply, "vertex", "texture_s", rply_vertex_callback,
                          mesh.uv.data(), 0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "texture_t", rply_vertex_callback,
                          mesh.uv.data(), 0x21) != 0)))
        ;
    else
        mesh.uv.resize(0);

    FaceCallbackContext context;
    context.triIndices.reserve(faceCount * 3);
    context.quadIndices.reserve(faceCount * 4);
    if (ply_set_read_cb(ply, "face", "vertex_indices", rply_face_callback, &context, 0) ==
        0)
        ErrorExit("%s: vertex indices not found in PLY file", filename);

    if (ply_set_read_cb(ply, "face", "face_indices", rply_faceindex_callback,
                        &mesh.faceIndices, 0) != 0)
        mesh.faceIndices.reserve(faceCount);

    if (ply_read(ply) == 0)
        ErrorExit("%s: unable to read the contents of PLY file", filename);

    mesh.triIndices = std::move(context.triIndices);
    mesh.quadIndices = std::move(context.quadIndices);

    ply_close(ply);

    for (int idx : mesh.triIndices)
        if (idx < 0 || idx >= mesh.p.size())
            ErrorExit("plymesh: Vertex index %i is out of bounds! "
                      "Valid range is [0..%i)",
                      idx, int(mesh.p.size()));
    for (int idx : mesh.quadIndices)
        if (idx < 0 || idx >= mesh.p.size())
            ErrorExit("plymesh: Vertex index %i is out of bounds! "
                      "Valid range is [0..%i)",
                      idx, int(mesh.p.size()));

    return mesh;
}